

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseRuleset(Parser *this,StyleRule *styleRule)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long in_FS_OFFSET;
  Declaration local_80;
  Declaration decl;
  QArrayDataPointer<QCss::BasicSelector> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (BasicSelector *)0x0;
  local_58.size = 0;
  bVar3 = parseSelector(this,(Selector *)&local_58);
  if (bVar3) {
    QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
              (&styleRule->selectors,(Selector *)&local_58);
    while( true ) {
      bVar3 = test(this,COMMA);
      skipSpace(this);
      if (!bVar3) break;
      decl.d.d.ptr = (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
                     (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0;
      bVar3 = parseNextSelector(this,(Selector *)&decl);
      if (!bVar3) {
        QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::BasicSelector> *)&decl);
        goto LAB_005465ec;
      }
      QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
                (&styleRule->selectors,(Selector *)&decl);
      QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::BasicSelector> *)&decl);
    }
    bVar3 = next(this,LBRACE);
    if (bVar3) {
      iVar1 = this->index;
      bVar3 = false;
      do {
        skipSpace(this);
        decl.d.d.ptr = (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
                       &DAT_aaaaaaaaaaaaaaaa;
        Declaration::Declaration(&decl);
        iVar2 = this->index;
        bVar4 = parseNextDeclaration(this,&decl);
        if (bVar4) {
LAB_00546567:
          if ((*(long *)((long)decl.d.d.ptr + 0x18) != 0) ||
             (*(int *)((long)decl.d.d.ptr + 0x20) != 0)) {
            QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>
                      (&styleRule->declarations,&decl);
          }
          bVar5 = true;
          bVar4 = bVar3;
        }
        else {
          this->index = iVar2;
          bVar5 = until(this,SEMICOLON,NONE);
          iVar2 = this->index;
          this->index = iVar1;
          bVar4 = until(this,RBRACE,NONE);
          if ((bVar5) && (iVar2 < this->index)) {
            Declaration::Declaration(&local_80);
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator=
                      (&decl.d,&local_80.d);
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
            ~QExplicitlySharedDataPointer(&local_80.d);
            this->index = iVar2 + -1;
            goto LAB_00546567;
          }
          skipSpace(this);
          bVar5 = false;
        }
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
        ~QExplicitlySharedDataPointer(&decl.d);
        if (!bVar5) goto LAB_005465ee;
        bVar5 = test(this,SEMICOLON);
        bVar3 = bVar4;
      } while (bVar5);
      bVar3 = next(this,RBRACE);
      if (bVar3) {
        skipSpace(this);
        bVar4 = true;
        goto LAB_005465ee;
      }
    }
  }
LAB_005465ec:
  bVar4 = false;
LAB_005465ee:
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Parser::parseRuleset(StyleRule *styleRule)
{
    Selector sel;
    if (!parseSelector(&sel)) return false;
    styleRule->selectors.append(sel);

    while (test(COMMA)) {
        skipSpace();
        Selector sel;
        if (!parseNextSelector(&sel)) return false;
        styleRule->selectors.append(sel);
    }

    skipSpace();
    if (!next(LBRACE)) return false;
    const int declarationStart = index;

    do {
        skipSpace();
        Declaration decl;
        const int rewind = index;
        if (!parseNextDeclaration(&decl)) {
            index = rewind;
            const bool foundSemicolon = until(SEMICOLON);
            const int semicolonIndex = index;

            index = declarationStart;
            const bool foundRBrace = until(RBRACE);

            if (foundSemicolon && semicolonIndex < index) {
                decl = Declaration();
                index = semicolonIndex - 1;
            } else {
                skipSpace();
                return foundRBrace;
            }
        }
        if (!decl.isEmpty())
            styleRule->declarations.append(decl);
    } while (test(SEMICOLON));

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}